

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertEqualString(char *expected,char *actual,char *msg,UNITY_UINT lineNumber)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) {
    return;
  }
  if (actual == (char *)0x0 || expected == (char *)0x0) {
    if (expected == actual) goto LAB_00107c30;
  }
  else {
    uVar3 = 0;
    do {
      pcVar1 = expected + uVar3;
      if ((*pcVar1 == '\0') && (actual[uVar3] == '\0')) goto LAB_00107c30;
      pcVar2 = actual + uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (*pcVar1 == *pcVar2);
  }
  Unity.CurrentTestFailed = 1;
LAB_00107c30:
  if (Unity.CurrentTestFailed == 0) {
    return;
  }
  UnityTestResultsFailBegin(lineNumber);
  UnityPrintExpectedAndActualStrings(expected,actual);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualString(const char* expected,
                            const char* actual,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber)
{
    UNITY_UINT32 i;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; expected[i] || actual[i]; i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrintExpectedAndActualStrings(expected, actual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}